

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tls.c
# Opt level: O2

void test_tls(void)

{
  uint __line;
  char cVar1;
  long lVar2;
  char *__assertion;
  int iVar3;
  bool bVar4;
  undefined1 local_f0 [8];
  thread_pool_t tp;
  thread_local_t tls;
  
  cVar1 = tp_init(local_f0,5);
  if (cVar1 == '\0') {
    __assertion = "tp_init(&tp, 5)";
    __line = 0x3a;
  }
  else {
    cVar1 = tp_start(local_f0);
    if (cVar1 == '\0') {
      __assertion = "tp_start(&tp)";
      __line = 0x3b;
    }
    else {
      lVar2 = tp_task_create(tls_create,tls_cleanup,0,0);
      if (lVar2 == 0) {
        __assertion = "task";
        __line = 0x3e;
      }
      else {
        cVar1 = tp_tls_init((undefined1 *)((long)&tp.no_task + 0x28),lVar2);
        if (cVar1 == '\0') {
          __assertion = "tp_tls_init(&tls, task)";
          __line = 0x3f;
        }
        else {
          iVar3 = 10;
          while( true ) {
            bVar4 = iVar3 == 0;
            iVar3 = iVar3 + -1;
            if (bVar4) {
              tp_join_tasks(local_f0);
              tp_destroy(local_f0);
              return;
            }
            lVar2 = tp_task_create(task_func,0,(undefined1 *)((long)&tp.no_task + 0x28),0);
            if (lVar2 == 0) break;
            tp_post_task(local_f0);
          }
          __assertion = "task";
          __line = 0x43;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_tls.c"
                ,__line,"void test_tls()");
}

Assistant:

void test_tls()
{
    int i;
    thread_pool_t tp;
    tp_task_t *task;
    thread_local_t tls;

    assert(tp_init(&tp, 5));
    assert(tp_start(&tp));

    task = tp_task_create(tls_create, tls_cleanup, NULL, 0);
    assert(task);
    assert(tp_tls_init(&tls, task));

    for (i = 0; i < LEN; ++i) {
        task = tp_task_create(task_func, NULL, &tls, 0);
        assert(task);
        tp_post_task(&tp, task);
    }

    tp_join_tasks(&tp);
    tp_destroy(&tp);
}